

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportingbase.cpp
# Opt level: O3

void __thiscall
trun::ResultsReportPinterBase::WriteLine(ResultsReportPinterBase *this,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list values;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_d8 = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e0 = &values[0].overflow_arg_area;
  local_e8 = 0x3000000010;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  vsnprintf(WriteLine::strComposed,0x100,format,&local_e8);
  fprintf((FILE *)this->fout,"%s%s\n",(this->indent)._M_dataplus._M_p,WriteLine::strComposed);
  return;
}

Assistant:

void ResultsReportPinterBase::WriteLine(const char *format,...) {
    static char strComposed[256];
    va_list values;
    va_start(values, format);
    vsnprintf(strComposed, sizeof(strComposed), format, values);
    fprintf(fout,"%s%s\n",indent.c_str(), strComposed);
    va_end(values);
}